

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sampler_custom_border_color
          (Impl *this,Value *state,VkSamplerCustomBorderColorCreateInfoEXT **out_info)

{
  uint uVar1;
  VkFormat VVar2;
  VkSamplerCustomBorderColorCreateInfoEXT *pVVar3;
  Type pGVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint32_t i;
  long lVar5;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkSamplerCustomBorderColorCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar3;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"customBorderColor");
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::operator[](pGVar4,(SizeType)lVar5);
    uVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(this_00);
    *(uint *)((long)&pVVar3->customBorderColor + lVar5 * 4) = uVar1;
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"format");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->format = VVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sampler_custom_border_color(const Value &state,
							    VkSamplerCustomBorderColorCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkSamplerCustomBorderColorCreateInfoEXT>();
	*out_info = info;

	for (uint32_t i = 0; i < 4; i++)
		info->customBorderColor.uint32[i] = state["customBorderColor"][i].GetUint();
	info->format = static_cast<VkFormat>(state["format"].GetUint());

	return true;
}